

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusItem(void)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiScrollFlags scroll_flags;
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  if ((GImGui->DebugLogFlags & 2) != 0) {
    DebugLog("FocusItem(0x%08x) in window \"%s\"\n",(ulong)(GImGui->LastItemData).ID,window->Name);
  }
  if ((pIVar1->DragDropActive == false) && (pIVar1->MovingWindow == (ImGuiWindow *)0x0)) {
    scroll_flags = 3;
    if (window->Appearing != false) {
      scroll_flags = 0x21;
    }
    SetNavWindow(window);
    NavMoveRequestSubmit(ImGuiDir_None,ImGuiDir_Up,0x6600,scroll_flags);
    GImGui->NavMoveScoringItems = false;
    NavApplyItemToResult(&pIVar1->NavMoveResultLocal);
    bVar2 = true;
    if (GImGui->NavMoveScoringItems == false) {
      bVar2 = GImGui->NavInitRequest;
    }
    GImGui->NavAnyRequest = bVar2;
  }
  else if ((pIVar1->DebugLogFlags & 2) != 0) {
    DebugLog("FocusItem() ignored while DragDropActive!\n");
    return;
  }
  return;
}

Assistant:

void ImGui::FocusItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IMGUI_DEBUG_LOG_FOCUS("FocusItem(0x%08x) in window \"%s\"\n", g.LastItemData.ID, window->Name);
    if (g.DragDropActive || g.MovingWindow != NULL) // FIXME: Opt-in flags for this?
    {
        IMGUI_DEBUG_LOG_FOCUS("FocusItem() ignored while DragDropActive!\n");
        return;
    }

    ImGuiNavMoveFlags move_flags = ImGuiNavMoveFlags_IsTabbing | ImGuiNavMoveFlags_FocusApi | ImGuiNavMoveFlags_NoSetNavHighlight | ImGuiNavMoveFlags_NoSelect;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    SetNavWindow(window);
    NavMoveRequestSubmit(ImGuiDir_None, ImGuiDir_Up, move_flags, scroll_flags);
    NavMoveRequestResolveWithLastItem(&g.NavMoveResultLocal);
}